

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::InitQueue(S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  Iterator *it;
  double dVar1;
  S2CellId SVar2;
  pointer pSVar3;
  ulong uVar4;
  size_type sVar5;
  bool bVar6;
  CellRelation CVar7;
  reference ppSVar8;
  S2ShapeIndexCell *index_cell;
  int iVar9;
  size_type i_00;
  int i;
  ulong uVar10;
  S1ChordAngle SVar11;
  S2Cap cap;
  S2RegionCoverer coverer;
  S2Cap search_cap;
  
  if (1 < (this->queue_).c.allocator_and_tag_.tag_.size_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&coverer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
               ,0x2b5,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)coverer.options_._8_8_,"Check failed: queue_.empty() ");
    abort();
  }
  if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    S2ShapeIndex::Iterator::Init(&this->iter_,this->index_,UNPOSITIONED);
  }
  (*this->target_->_vptr_S2DistanceTarget[2])(&cap);
  if (0.0 <= cap.radius_.length2_) {
    if (this->options_->max_results_ == 1) {
      bVar6 = S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>
                        (&cap.center_,&this->iter_);
      if (bVar6) {
        SVar11 = S1ChordAngle::Zero();
        SVar2.id_ = (((this->iter_).iter_._M_t.
                      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_
                    ).id_;
        coverer.region_ = (S2Region *)S2ShapeIndex::Iterator::cell(&this->iter_);
        coverer.options_._0_8_ = SVar11;
        coverer.options_._8_8_ = SVar2.id_;
        ProcessEdges(this,(QueueEntry *)&coverer);
        dVar1 = (this->distance_limit_).super_S1ChordAngle.length2_;
        SVar11 = S1ChordAngle::Zero();
        if ((dVar1 == SVar11.length2_) && (!NAN(dVar1) && !NAN(SVar11.length2_))) {
          return;
        }
      }
    }
    if ((this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      InitCovering(this);
    }
    dVar1 = (this->distance_limit_).super_S1ChordAngle.length2_;
    SVar11 = S1ChordAngle::Infinity();
    if ((dVar1 != SVar11.length2_) || (NAN(dVar1) || NAN(SVar11.length2_))) {
      S2RegionCoverer::S2RegionCoverer(&coverer);
      S2RegionCoverer::Options::set_max_cells(&coverer.options_,4);
      SVar11 = S2MinDistance::GetChordAngleBound(&this->distance_limit_);
      SVar11 = operator+(cap.radius_,SVar11);
      S2Cap::S2Cap(&search_cap,&cap.center_,SVar11);
      S2RegionCoverer::GetFastCovering
                (&coverer,&search_cap.super_S2Region,&this->max_distance_covering_);
      S2CellUnion::GetIntersection
                (&this->index_covering_,&this->max_distance_covering_,&this->initial_cells_);
      it = &this->iter_;
      iVar9 = 0;
      i_00 = 0;
LAB_001fdb71:
      uVar10 = (ulong)iVar9;
      pSVar3 = (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar10 < (ulong)((long)(this->initial_cells_).
                                 super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pSVar3 >> 3)) {
        SVar2.id_ = pSVar3[uVar10].id_;
        sVar5 = (long)(int)i_00;
        do {
          i_00 = sVar5;
          uVar4 = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                  _M_impl.super__Vector_impl_data._M_start[i_00].id_;
          sVar5 = i_00 + 1;
        } while ((uVar4 - 1 | uVar4) < SVar2.id_);
        if (SVar2.id_ == uVar4) {
          ppSVar8 = absl::
                    InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ::operator[](&this->index_cells_,i_00);
          ProcessOrEnqueue(this,SVar2,*ppSVar8);
          iVar9 = iVar9 + 1;
          i_00 = i_00 + 1;
        }
        else {
          CVar7 = S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>(SVar2,it);
          if (CVar7 == SUBDIVIDED) {
            ProcessOrEnqueue(this,SVar2,(S2ShapeIndexCell *)0x0);
LAB_001fdc6a:
            iVar9 = iVar9 + 1;
          }
          else {
            if (CVar7 != INDEXED) goto LAB_001fdc6a;
            SVar2.id_ = (((it->iter_)._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)
                        ->id_).id_;
            index_cell = S2ShapeIndex::Iterator::cell(it);
            ProcessOrEnqueue(this,SVar2,index_cell);
            pSVar3 = (this->initial_cells_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            SVar2.id_ = (((this->iter_).iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)
                        ->id_).id_;
            do {
              uVar10 = uVar10 + 1;
              iVar9 = (int)uVar10;
              if ((ulong)((long)(this->initial_cells_).
                                super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) <= uVar10)
              break;
            } while (pSVar3[uVar10].id_ <= (SVar2.id_ - 1 | SVar2.id_));
          }
        }
        goto LAB_001fdb71;
      }
      S2RegionCoverer::~S2RegionCoverer(&coverer);
    }
    else {
      for (uVar10 = 0;
          pSVar3 = (this->index_covering_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          uVar10 < (ulong)((long)(this->index_covering_).
                                 super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pSVar3 >> 3);
          uVar10 = uVar10 + 1) {
        SVar2.id_ = pSVar3[uVar10].id_;
        ppSVar8 = absl::
                  InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                  ::operator[](&this->index_cells_,uVar10);
        ProcessOrEnqueue(this,SVar2,*ppSVar8);
      }
    }
  }
  return;
}

Assistant:

int32 edge_id() const { return edge_id_; }